

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::BuildIRForInlinee
          (Inline *this,Func *inlinee,JITTimeFunctionBody *funcBody,Instr *callInstr,
          bool isApplyTarget,uint recursiveInlineDepth)

{
  Func *this_00;
  SymTable *this_01;
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint uVar4;
  RegSlot IDIncrease;
  StackSym *pSVar5;
  undefined4 *puVar6;
  SymOpnd *pSVar7;
  JITTimeFunctionBody *pJVar8;
  intptr_t iVar9;
  intptr_t iVar10;
  uint uVar11;
  ushort callerArgOutCount;
  Instr *pIVar12;
  Instr *pIVar13;
  undefined1 local_268 [8];
  Inline recursiveInliner;
  Instr *apIStack_e0 [2];
  Instr *argOuts [15];
  AutoCodeGenPhase __autoCodeGen;
  
  this_00 = this->topFunc;
  uVar11 = this->currentForInDepth;
  uVar4 = JITTimeFunctionBody::GetForInLoopDepth(funcBody);
  Func::UpdateForInLoopMaxDepth(this_00,uVar11 + uVar4);
  inlinee->m_forInLoopBaseDepth = this->currentForInDepth;
  argOuts[0xd] = (Instr *)0xfefefefefefefefe;
  argOuts[0xb] = (Instr *)0xfefefefefefefefe;
  argOuts[0xc] = (Instr *)0xfefefefefefefefe;
  argOuts[9] = (Instr *)0xfefefefefefefefe;
  argOuts[10] = (Instr *)0xfefefefefefefefe;
  argOuts[7] = (Instr *)0xfefefefefefefefe;
  argOuts[8] = (Instr *)0xfefefefefefefefe;
  argOuts[5] = (Instr *)0xfefefefefefefefe;
  argOuts[6] = (Instr *)0xfefefefefefefefe;
  argOuts[3] = (Instr *)0xfefefefefefefefe;
  argOuts[4] = (Instr *)0xfefefefefefefefe;
  argOuts[1] = (Instr *)0xfefefefefefefefe;
  argOuts[2] = (Instr *)0xfefefefefefefefe;
  apIStack_e0[1] = (Instr *)0xfefefefefefefefe;
  argOuts[0] = (Instr *)0xfefefefefefefefe;
  pSVar5 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar12 = (pSVar5->field_5).m_instrDef;
  if ((pIVar12 != (Instr *)0x0 & pSVar5->field_0x18) == 1) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar2) {
LAB_00505d72:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    pIVar12 = (pSVar5->field_5).m_instrDef;
  }
  callerArgOutCount = 0;
  do {
    if (pIVar12->m_src2 == (Opnd *)0x0) {
LAB_00505b3b:
      pIVar13 = (Instr *)0x0;
    }
    else {
      bVar2 = IR::Opnd::IsSymOpnd(pIVar12->m_src2);
      if (!bVar2) goto LAB_00505b3b;
      pSVar7 = IR::Opnd::AsSymOpnd(pIVar12->m_src2);
      pSVar5 = Sym::AsStackSym(pSVar7->m_sym);
      bVar2 = StackSym::IsArgSlotSym(pSVar5);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar2) goto LAB_00505d72;
        *puVar6 = 0;
      }
      if (((pSVar5->field_0x18 & 1) == 0) || ((pSVar5->field_5).m_instrDef == (Instr *)0x0)) {
        bVar2 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase);
        if (!bVar2) {
          bVar2 = Func::IsInPhase(callInstr->m_func,FGBuildPhase);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar2) goto LAB_00505d72;
            *puVar6 = 0;
          }
        }
      }
      if ((pSVar5->field_0x18 & 1) == 0) goto LAB_00505b3b;
      pIVar13 = (pSVar5->field_5).m_instrDef;
    }
    if (pIVar12->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar12->m_opcode == StartCall) {
        if (pIVar13 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar2) goto LAB_00505d72;
          *puVar6 = 0;
        }
        break;
      }
      pSVar7 = IR::Opnd::AsSymOpnd(pIVar12->m_dst);
      pSVar5 = Sym::AsStackSym(pSVar7->m_sym);
      AVar3 = StackSym::GetArgSlotNum(pSVar5);
      apIStack_e0[AVar3] = pIVar12;
      callerArgOutCount = callerArgOutCount + 1;
    }
    pIVar12 = pIVar13;
  } while (pIVar13 != (Instr *)0x0);
  inlinee->actualCount = callerArgOutCount;
  this_01 = this->topFunc->m_symTable;
  inlinee->m_symTable = this_01;
  this_01->m_IDAdjustment = this_01->m_currentID;
  IDIncrease = JITTimeFunctionBody::GetLocalsCount(funcBody);
  SymTable::IncreaseStartingID(this_01,IDIncrease);
  argOuts[0xe] = (Instr *)this->topFunc;
  Func::BeginPhase((Func *)argOuts[0xe],IRBuilderPhase);
  pJVar8 = Func::GetJITFunctionBody(this->topFunc);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar8);
  if (bVar2) {
    IRBuilderAsmJs::IRBuilderAsmJs((IRBuilderAsmJs *)local_268,inlinee);
    IRBuilderAsmJs::Build((IRBuilderAsmJs *)local_268);
  }
  else {
    IRBuilder::IRBuilder((IRBuilder *)local_268,inlinee);
    IRBuilder::Build((IRBuilder *)local_268);
    IRBuilder::~IRBuilder((IRBuilder *)local_268);
  }
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)(argOuts + 0xe),this->topFunc,IRBuilderPhase,false,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)(argOuts + 0xe));
  inlinee->m_symTable->m_IDAdjustment = 0;
  local_268 = (undefined1  [8])this->topFunc;
  recursiveInliner._24_8_ = this->inliningHeuristics;
  recursiveInliner.currentInlineeFrameSlot = this->isInLoop;
  recursiveInliner.topFunc._0_4_ = 0;
  recursiveInliner.topFunc._4_4_ = (uint)callerArgOutCount + this->currentInlineeFrameSlot + 3;
  recursiveInliner.currentForInDepth._1_1_ = 0;
  recursiveInliner.currentForInDepth._0_1_ = isApplyTarget;
  recursiveInliner.lastStatementBoundary = (PragmaInstr *)this;
  recursiveInliner.prevFrame = (Inline *)callInstr;
  pJVar8 = Func::GetJITFunctionBody(inlinee);
  iVar9 = JITTimeFunctionBody::GetAddr(pJVar8);
  pJVar8 = Func::GetJITFunctionBody(callInstr->m_func);
  iVar10 = JITTimeFunctionBody::GetAddr(pJVar8);
  uVar11 = 0;
  if (iVar9 == iVar10) {
    uVar11 = recursiveInlineDepth + 1;
  }
  Optimize((Inline *)local_268,inlinee,apIStack_e0 + 1,callerArgOutCount,uVar11);
  AVar3 = JITTimeFunctionBody::GetInParamsCount(funcBody);
  if (AVar3 < 0x10) {
    return;
  }
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void
Inline::BuildIRForInlinee(Func *inlinee, JITTimeFunctionBody *funcBody, IR::Instr *callInstr, bool isApplyTarget, uint recursiveInlineDepth)
{
    // Update for..in max depth for the whole function
    this->topFunc->UpdateForInLoopMaxDepth(this->currentForInDepth + funcBody->GetForInLoopDepth());

    // Set for..in base depth of inlinee
    inlinee->m_forInLoopBaseDepth = this->currentForInDepth;

    Js::ArgSlot actualsCount = 0;
    IR::Instr *argOuts[Js::InlineeCallInfo::MaxInlineeArgoutCount];
#if DBG
    memset(argOuts, 0xFE, sizeof(argOuts));
#endif

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        StackSym *argSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        argOuts[argSym->GetArgSlotNum() - 1] = argInstr;
        actualsCount++;
        return false;
    });

    inlinee->actualCount = actualsCount;

    inlinee->m_symTable = this->topFunc->m_symTable;

    inlinee->m_symTable->SetIDAdjustment();
    inlinee->m_symTable->IncreaseStartingID(funcBody->GetLocalsCount());

    BEGIN_CODEGEN_PHASE(this->topFunc, Js::IRBuilderPhase);

#ifdef ASMJS_PLAT
    if (this->topFunc->GetJITFunctionBody()->IsAsmJsMode())
    {
        IRBuilderAsmJs irBuilder(inlinee);
        irBuilder.Build();
    }
    else
#endif
    {
        IRBuilder irBuilder(inlinee);
        irBuilder.Build();
    }

    END_CODEGEN_PHASE_NO_DUMP(this->topFunc, Js::IRBuilderPhase);

    inlinee->m_symTable->ClearIDAdjustment();

    Inline recursiveInliner(this->topFunc, this->inliningHeuristics, this->isInLoop, currentInlineeFrameSlot + Js::Constants::InlineeMetaArgCount + actualsCount, isApplyTarget, this, callInstr);
    recursiveInliner.Optimize(inlinee, argOuts, actualsCount, inlinee->GetJITFunctionBody()->GetAddr() == callInstr->m_func->GetJITFunctionBody()->GetAddr() ? recursiveInlineDepth + 1 : 0);

#ifdef DBG
    Js::ArgSlot formalCount = funcBody->GetInParamsCount();

    if (formalCount > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        Fatal();
    }
#endif
}